

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  char cVar1;
  u8 uVar2;
  u8 uVar3;
  ushort uVar4;
  ushort uVar5;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  u8 *puVar6;
  MemPage *pPage_00;
  u8 *pTemp;
  bool bVar7;
  char cVar8;
  u16 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined7 in_register_00000031;
  MemPage **ppMVar13;
  ulong uVar14;
  uint uVar15;
  int local_5c;
  MemPage **local_58;
  Pgno local_50;
  uint local_4c;
  CellInfo info;
  
  uVar12 = (uint)CONCAT71(in_register_00000031,flags);
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  uVar15 = uVar12;
  if ((pCur->eState == '\x03') && (iVar10 = btreeRestoreCursorPosition(pCur), iVar10 != 0)) {
    return iVar10;
  }
  cVar1 = pCur->iPage;
  uVar4 = pCur->ix;
  pPage = pCur->pPage;
  uVar5 = pPage->maskPage;
  uVar2 = pPage->aCellIdx[(ulong)uVar4 * 2];
  uVar3 = pPage->aCellIdx[(ulong)uVar4 * 2 + 1];
  puVar6 = pPage->aData;
  if ((pPage->nFree < 0) && (iVar10 = btreeComputeFreeSpace(pPage), iVar10 != 0)) {
    return 0xb;
  }
  bVar7 = true;
  if ((flags & 2) != 0) {
    if (pPage->leaf != '\0') {
      iVar10 = pPage->nFree;
      uVar9 = cellSizePtr(pPage,puVar6 + (CONCAT11(uVar2,uVar3) & uVar5));
      uVar15 = 3;
      if (((int)(iVar10 + (uint)uVar9 + 2) <= (int)((pBt->usableSize * 2) / 3)) &&
         (pPage->nCell != 1)) {
        bVar7 = false;
        goto LAB_0015750f;
      }
    }
    iVar10 = saveCursorKey(pCur);
    if (iVar10 != 0) {
      return iVar10;
    }
  }
LAB_0015750f:
  uVar14 = CONCAT71(in_register_00000031,flags) & 0xffffffff;
  if (((pPage->leaf != '\0') || (iVar10 = sqlite3BtreePrevious(pCur,uVar15), iVar10 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 ||
      (iVar10 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar10 == 0)))) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
    }
    iVar10 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar10 == 0) {
      local_5c = clearCell(pPage,puVar6 + (CONCAT11(uVar2,uVar3) & uVar5),&info);
      dropCell(pPage,(uint)uVar4,(uint)info.nSize,&local_5c);
      iVar10 = local_5c;
      if (local_5c == 0) {
        if (pPage->leaf == '\0') {
          ppMVar13 = &pCur->pPage;
          pPage_00 = *ppMVar13;
          if ((pPage_00->nFree < 0) &&
             (local_58 = ppMVar13, iVar10 = btreeComputeFreeSpace(pPage_00), ppMVar13 = local_58,
             iVar10 != 0)) {
            return iVar10;
          }
          if ((int)cVar1 < pCur->iPage + -1) {
            ppMVar13 = pCur->apPage + (long)(int)cVar1 + 1;
          }
          uVar15 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                   pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                         pPage_00->maskPage);
          if (uVar15 < 4) {
            iVar10 = sqlite3CorruptError(0x119a4);
            return iVar10;
          }
          local_50 = (*ppMVar13)->pgno;
          puVar6 = pPage_00->aData;
          local_4c = uVar12;
          uVar9 = (*pPage_00->xCellSize)(pPage_00,puVar6 + uVar15);
          local_58 = (MemPage **)(ulong)uVar9;
          pTemp = pBt->pTmpSpace;
          local_5c = sqlite3PagerWrite(pPage_00->pDbPage);
          if (local_5c == 0) {
            insertCell(pPage,(uint)uVar4,puVar6 + uVar15 + -4,(int)local_58 + 4,pTemp,local_50,
                       &local_5c);
          }
          dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_5c);
          uVar14 = (ulong)local_4c;
          if (local_5c != 0) {
            return local_5c;
          }
        }
        iVar10 = balance(pCur);
        if (iVar10 == 0) {
          if (cVar1 < pCur->iPage) {
            releasePageNotNull(pCur->pPage);
            cVar8 = pCur->iPage + -1;
            pCur->iPage = cVar8;
            while (cVar1 < cVar8) {
              pCur->iPage = cVar8 + -1;
              releasePage(pCur->apPage[cVar8]);
              cVar8 = pCur->iPage;
            }
            pCur->pPage = pCur->apPage[cVar8];
            iVar10 = balance(pCur);
            if (iVar10 != 0) {
              return iVar10;
            }
          }
          if (bVar7) {
            iVar11 = moveToRoot(pCur);
            if ((uVar14 & 2) != 0) {
              btreeReleaseAllCursorPages(pCur);
              pCur->eState = '\x03';
            }
            iVar10 = 0;
            if (iVar11 != 0x10) {
              iVar10 = iVar11;
            }
          }
          else {
            pCur->eState = '\x02';
            uVar5 = pPage->nCell;
            if (uVar4 < uVar5) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->ix = uVar5 - 1;
            }
            iVar10 = 0;
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState==CURSOR_REQUIRESEEK ){
    rc = btreeRestoreCursorPosition(pCur);
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ) return SQLITE_CORRUPT;

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}